

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialProps.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  RealType bufferLength;
  RealType threshDens;
  RealType centroidY;
  RealType centroidX;
  RealType solidZ_1;
  RealType dropletR;
  RealType solidZ;
  unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_> analyzer;
  int privilegedAxis;
  SimInfo *info;
  SimCreator creator;
  char *sele2Env;
  char *sele1Env;
  string sele2;
  string sele1;
  string dumpFileName;
  gengetopt_args_info args_info;
  undefined1 in_stack_000105e7;
  string *in_stack_000105e8;
  SimCreator *in_stack_000105f0;
  string *in_stack_fffffffffffffbb8;
  SequentialAnalyzer *in_stack_fffffffffffffbc0;
  unique_ptr<OpenMD::COMVel,_std::default_delete<OpenMD::COMVel>_> *in_stack_fffffffffffffbc8;
  __uniq_ptr_impl<OpenMD::ContactAngle2,_std::default_delete<OpenMD::ContactAngle2>_> *__u;
  __uniq_ptr_impl<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
  *in_stack_fffffffffffffbd0;
  double *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  errorStruct *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  SimInfo **in_stack_fffffffffffffc08;
  double *in_stack_fffffffffffffc10;
  errorStruct *in_stack_fffffffffffffc20;
  errorStruct *in_stack_fffffffffffffc28;
  errorStruct *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc38;
  int *in_stack_fffffffffffffc40;
  int *in_stack_fffffffffffffc48;
  allocator<char> local_381;
  string local_380 [40];
  __uniq_ptr_impl<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
  local_358;
  __uniq_ptr_impl<OpenMD::ContactAngle2,_std::default_delete<OpenMD::ContactAngle2>_> local_350;
  undefined1 local_348 [16];
  Snapshot *local_338;
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_320 [4];
  undefined4 local_2dc;
  SimInfo *local_2d8;
  pointer local_2a8;
  pointer local_2a0;
  string local_298 [32];
  string local_278 [55];
  allocator<char> local_241;
  string local_240 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1f8;
  pointer local_1e0;
  pointer local_1c8;
  string local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_168;
  _func_int **local_150;
  Snapshot *local_138;
  pointer local_120;
  _Head_base<0UL,_OpenMD::ContactAngle2_*,_false> local_108;
  _Head_base<0UL,_OpenMD::SequentialAnalyzer_*,_false> local_f0;
  int local_74;
  int local_70;
  int local_6c;
  int local_5c;
  int local_58;
  int local_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_4 = 0;
  iVar2 = cmdline_parser((int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                         (char **)in_stack_fffffffffffffbb8,(gengetopt_args_info *)0x13eafd);
  if (iVar2 != 0) {
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::string(local_278);
  std::__cxx11::string::string(local_298);
  if (local_70 == 0) {
    local_2a0 = (pointer)getenv("SELECTION1");
    if (local_2a0 == (pointer)0x0) {
      std::__cxx11::string::operator=(local_278,"select all");
    }
    else {
      std::__cxx11::string::operator=(local_278,(char *)local_2a0);
    }
  }
  else {
    std::__cxx11::string::operator=(local_278,(char *)local_1e0);
  }
  if (local_6c == 0) {
    local_2a8 = (pointer)getenv("SELECTION2");
    if (local_2a8 == (pointer)0x0) {
      std::__cxx11::string::operator=(local_298,local_278);
    }
    else {
      std::__cxx11::string::operator=(local_298,(char *)local_2a8);
    }
  }
  else {
    std::__cxx11::string::operator=(local_298,(char *)local_1c8);
  }
  OpenMD::SimCreator::SimCreator((SimCreator *)0x13ecb9);
  local_2d8 = OpenMD::SimCreator::createSim
                        (in_stack_000105f0,in_stack_000105e8,(bool)in_stack_000105e7);
  if (local_1b0[1].field_2._0_4_ == 0) {
    local_2dc = 0;
  }
  else if (local_1b0[1].field_2._0_4_ == 1) {
    local_2dc = 1;
  }
  else {
    local_2dc = 2;
  }
  std::unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>::
  unique_ptr<std::default_delete<OpenMD::SequentialAnalyzer>,void>
            ((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
              *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  if (local_40 == 0) {
    if (local_3c == 0) {
      if (local_34 == 0) {
        if (local_38 == 0) {
          if (local_24 == 0) {
            if (local_28 == 0) {
              if (local_30 == 0) {
                if (local_2c != 0) {
                  local_338 = (Snapshot *)0x0;
                  if (local_54 == 0) {
                    in_stack_fffffffffffffc30 = &painCave;
                    snprintf(painCave.errMsg,2000,"--referenceZ must be set if --ca2 is used\n");
                    in_stack_fffffffffffffc30->severity = 1;
                    in_stack_fffffffffffffc30->isFatal = 1;
                    simError();
                  }
                  else {
                    local_338 = local_138;
                  }
                  local_348._8_8_ = (SimInfo *)0x0;
                  if (local_5c == 0) {
                    in_stack_fffffffffffffc28 = &painCave;
                    snprintf(painCave.errMsg,2000,"--centroidX must be set if --ca2 is used\n");
                    in_stack_fffffffffffffc28->severity = 1;
                    in_stack_fffffffffffffc28->isFatal = 1;
                    simError();
                  }
                  else {
                    local_348._8_8_ = local_168._M_allocated_capacity;
                  }
                  local_348._0_8_ = (_func_int **)0x0;
                  if (local_58 == 0) {
                    in_stack_fffffffffffffc20 = &painCave;
                    snprintf(painCave.errMsg,2000,"--centroidY must be set if --ca2 is used\n");
                    in_stack_fffffffffffffc20->severity = 1;
                    in_stack_fffffffffffffc20->isFatal = 1;
                    simError();
                  }
                  else {
                    local_348._0_8_ = local_150;
                  }
                  local_350._M_t.
                  super__Tuple_impl<0UL,_OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>
                  .super__Head_base<0UL,_OpenMD::ContactAngle2_*,_false>._M_head_impl =
                       (tuple<OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>)
                       (_Tuple_impl<0UL,_OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>
                        )0x0;
                  if (local_50._M_allocated_capacity._4_4_ == 0) {
                    snprintf(painCave.errMsg,2000,"--threshDens must be set if --ca2 is used\n");
                    painCave.severity = 1;
                    painCave.isFatal = 1;
                    simError();
                  }
                  else {
                    local_350._M_t.
                    super__Tuple_impl<0UL,_OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>
                    .super__Head_base<0UL,_OpenMD::ContactAngle2_*,_false>._M_head_impl =
                         (tuple<OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>
                          )(tuple<OpenMD::ContactAngle2_*,_std::default_delete<OpenMD::ContactAngle2>_>
                            )local_108._M_head_impl;
                  }
                  local_358._M_t.
                  super__Tuple_impl<0UL,_OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                  .super__Head_base<0UL,_OpenMD::SequentialAnalyzer_*,_false>._M_head_impl =
                       (tuple<OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                        )(_Tuple_impl<0UL,_OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                          )0x0;
                  if (local_50._8_4_ == 0) {
                    peVar4 = &painCave;
                    snprintf(painCave.errMsg,2000,"--bufferLength must be set if --ca2 is used\n");
                    peVar4->severity = 1;
                    peVar4->isFatal = 1;
                    simError();
                  }
                  else {
                    local_358._M_t.
                    super__Tuple_impl<0UL,_OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                    .super__Head_base<0UL,_OpenMD::SequentialAnalyzer_*,_false>._M_head_impl =
                         (tuple<OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                          )(tuple<OpenMD::SequentialAnalyzer_*,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                            )local_f0._M_head_impl;
                  }
                  in_stack_fffffffffffffbd0 = &local_358;
                  __u = &local_350;
                  in_stack_fffffffffffffbc0 = (SequentialAnalyzer *)local_348;
                  in_stack_fffffffffffffbb8 = (string *)(local_348 + 8);
                  std::
                  make_unique<OpenMD::ContactAngle2,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,double&,double&,int&,int&>
                            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                             in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                             (double *)in_stack_fffffffffffffbe8,(double *)in_stack_fffffffffffffc20
                             ,(double *)in_stack_fffffffffffffc28,
                             (double *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
                             in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
                  std::
                  unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>
                  ::operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                               *)in_stack_fffffffffffffbd0,
                              (unique_ptr<OpenMD::ContactAngle2,_std::default_delete<OpenMD::ContactAngle2>_>
                               *)__u);
                  std::
                  unique_ptr<OpenMD::ContactAngle2,_std::default_delete<OpenMD::ContactAngle2>_>::
                  ~unique_ptr((unique_ptr<OpenMD::ContactAngle2,_std::default_delete<OpenMD::ContactAngle2>_>
                               *)in_stack_fffffffffffffbc0);
                }
              }
              else {
                local_320[0]._M_allocated_capacity = (Snapshot *)0x0;
                if (local_54 == 0) {
                  peVar4 = &painCave;
                  snprintf(painCave.errMsg,2000,"--referenceZ must be set if --ca1 is used\n");
                  peVar4->severity = 1;
                  peVar4->isFatal = 1;
                  simError();
                }
                else {
                  local_320[0]._M_allocated_capacity = local_138;
                }
                local_328 = (pointer)0x0;
                if (local_50._M_allocated_capacity._0_4_ == 0) {
                  peVar4 = &painCave;
                  snprintf(painCave.errMsg,2000,"--dropletR must be set if --ca1 is used\n");
                  peVar4->severity = 1;
                  peVar4->isFatal = 1;
                  simError();
                }
                else {
                  local_328 = local_120;
                }
                in_stack_fffffffffffffbb8 = (string *)&local_328;
                std::
                make_unique<OpenMD::ContactAngle1,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&>
                          ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                           in_stack_fffffffffffffbd8,in_stack_fffffffffffffc10);
                std::
                unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>
                ::operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                             *)in_stack_fffffffffffffbd0,
                            (unique_ptr<OpenMD::ContactAngle1,_std::default_delete<OpenMD::ContactAngle1>_>
                             *)in_stack_fffffffffffffbc8);
                std::unique_ptr<OpenMD::ContactAngle1,_std::default_delete<OpenMD::ContactAngle1>_>
                ::~unique_ptr((unique_ptr<OpenMD::ContactAngle1,_std::default_delete<OpenMD::ContactAngle1>_>
                               *)in_stack_fffffffffffffbc0);
              }
            }
            else if (local_50._12_4_ == 0) {
              peVar4 = &painCave;
              snprintf(painCave.errMsg,2000,
                       "A cutoff radius (rcut) must be specified when calculating\n\tGeneralized Coordinate Number"
                      );
              peVar4->severity = 1;
              peVar4->isFatal = 1;
              simError();
            }
            else {
              in_stack_fffffffffffffbb8 = local_1b0;
              std::
              make_unique<OpenMD::GCNSeq,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,int&>
                        ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                         in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffc10);
              std::
              unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>
              ::operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                           *)in_stack_fffffffffffffbd0,
                          (unique_ptr<OpenMD::GCNSeq,_std::default_delete<OpenMD::GCNSeq>_> *)
                          in_stack_fffffffffffffbc8);
              std::unique_ptr<OpenMD::GCNSeq,_std::default_delete<OpenMD::GCNSeq>_>::~unique_ptr
                        ((unique_ptr<OpenMD::GCNSeq,_std::default_delete<OpenMD::GCNSeq>_> *)
                         in_stack_fffffffffffffbc0);
            }
          }
          else {
            std::
            make_unique<OpenMD::Equipartition,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                      ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                       in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
            std::
            unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>::
            operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                       *)in_stack_fffffffffffffbd0,
                      (unique_ptr<OpenMD::Equipartition,_std::default_delete<OpenMD::Equipartition>_>
                       *)in_stack_fffffffffffffbc8);
            std::unique_ptr<OpenMD::Equipartition,_std::default_delete<OpenMD::Equipartition>_>::
            ~unique_ptr((unique_ptr<OpenMD::Equipartition,_std::default_delete<OpenMD::Equipartition>_>
                         *)in_stack_fffffffffffffbc0);
          }
        }
        else {
          std::
          make_unique<OpenMD::CountDifference,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                    ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
          std::
          unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>::
          operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                     *)in_stack_fffffffffffffbd0,
                    (unique_ptr<OpenMD::CountDifference,_std::default_delete<OpenMD::CountDifference>_>
                     *)in_stack_fffffffffffffbc8);
          std::unique_ptr<OpenMD::CountDifference,_std::default_delete<OpenMD::CountDifference>_>::
          ~unique_ptr((unique_ptr<OpenMD::CountDifference,_std::default_delete<OpenMD::CountDifference>_>
                       *)in_stack_fffffffffffffbc0);
        }
      }
      else {
        std::
        make_unique<OpenMD::FluxOut,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,int&>
                  ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
        std::unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>
        ::operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                     *)in_stack_fffffffffffffbd0,
                    (unique_ptr<OpenMD::FluxOut,_std::default_delete<OpenMD::FluxOut>_> *)
                    in_stack_fffffffffffffbc8);
        std::unique_ptr<OpenMD::FluxOut,_std::default_delete<OpenMD::FluxOut>_>::~unique_ptr
                  ((unique_ptr<OpenMD::FluxOut,_std::default_delete<OpenMD::FluxOut>_> *)
                   in_stack_fffffffffffffbc0);
      }
    }
    else {
      std::
      make_unique<OpenMD::COMVel,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      std::unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>::
      operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                 *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      std::unique_ptr<OpenMD::COMVel,_std::default_delete<OpenMD::COMVel>_>::~unique_ptr
                ((unique_ptr<OpenMD::COMVel,_std::default_delete<OpenMD::COMVel>_> *)
                 in_stack_fffffffffffffbc0);
    }
  }
  else {
    std::
    make_unique<OpenMD::CenterOfMass,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((SimInfo **)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::unique_ptr<OpenMD::SequentialAnalyzer,std::default_delete<OpenMD::SequentialAnalyzer>>::
    operator=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
               *)in_stack_fffffffffffffbd0,
              (unique_ptr<OpenMD::CenterOfMass,_std::default_delete<OpenMD::CenterOfMass>_> *)
              in_stack_fffffffffffffbc8);
    std::unique_ptr<OpenMD::CenterOfMass,_std::default_delete<OpenMD::CenterOfMass>_>::~unique_ptr
              ((unique_ptr<OpenMD::CenterOfMass,_std::default_delete<OpenMD::CenterOfMass>_> *)
               in_stack_fffffffffffffbc0);
  }
  bVar1 = std::operator!=((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                           *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  if (bVar1) {
    if (local_74 != 0) {
      pSVar3 = std::
               unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
               ::operator->((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                             *)0x13f498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f8._M_allocated_capacity,(char *)pSVar3,
                 (allocator<char> *)in_stack_fffffffffffffbf0);
      OpenMD::SequentialAnalyzer::setOutputName(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8)
      ;
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator(&local_381);
    }
    pSVar3 = std::
             unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
             ::operator->((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
                           *)0x13f55b);
    (*pSVar3->_vptr_SequentialAnalyzer[2])();
  }
  else {
    peVar4 = &painCave;
    snprintf(painCave.errMsg,2000,"SequentialProps: No Analyzer was created, nothing to do!");
    peVar4->severity = 1;
    peVar4->isFatal = 1;
    simError();
  }
  if (local_2d8 != (SimInfo *)0x0) {
    (*local_2d8->_vptr_SimInfo[1])();
  }
  local_4 = 0;
  std::unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>::
  ~unique_ptr((unique_ptr<OpenMD::SequentialAnalyzer,_std::default_delete<OpenMD::SequentialAnalyzer>_>
               *)in_stack_fffffffffffffbd0);
  OpenMD::SimCreator::~SimCreator((SimCreator *)0x13f5ef);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_240);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  std::string dumpFileName = args_info.input_arg;

  std::string sele1;
  std::string sele2;

  // check the first selection argument, or set it to the environment
  // variable, or failing that, set it to "select all"

  if (args_info.sele1_given) {
    sele1 = args_info.sele1_arg;
  } else {
    char* sele1Env = getenv("SELECTION1");
    if (sele1Env) {
      sele1 = sele1Env;
    } else {
      sele1 = "select all";
    }
  }

  // check the second selection argument, or set it to the environment
  // variable, or failing that, set it to the first selection

  if (args_info.sele2_given) {
    sele2 = args_info.sele2_arg;
  } else {
    char* sele2Env = getenv("SELECTION2");
    if (sele2Env) {
      sele2 = sele2Env;
    } else {
      // If sele2 is not specified, then the default behavior
      // should be what is already intended for sele1
      sele2 = sele1;
    }
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(dumpFileName, false);

  // convert privilegedAxis to corresponding integer
  // x axis -> 0
  // y axis -> 1
  // z axis -> 2 (default)

  int privilegedAxis;
  switch (args_info.privilegedAxis_arg) {
  case privilegedAxis_arg_x:
    privilegedAxis = 0;
    break;
  case privilegedAxis_arg_y:
    privilegedAxis = 1;
    break;
  case privilegedAxis_arg_z:
  default:
    privilegedAxis = 2;
    break;
  }

  std::unique_ptr<SequentialAnalyzer> analyzer {nullptr};

  if (args_info.com_given) {
    analyzer = std::make_unique<CenterOfMass>(info, dumpFileName, sele1, sele2);
  } else if (args_info.comvel_given) {
    analyzer = std::make_unique<COMVel>(info, dumpFileName, sele1, sele2);
  } else if (args_info.fluxOut_given) {
    analyzer = std::make_unique<FluxOut>(info, dumpFileName, sele1,
					 privilegedAxis);
  } else if (args_info.deltaCount_given) {
    analyzer = std::make_unique<CountDifference>(info, dumpFileName, sele1,
						 sele2);
  } else if (args_info.testequi_given) {
    analyzer = std::make_unique<Equipartition>(info, dumpFileName, sele1,
					       sele2);
  } else if (args_info.gcn_given) {
    if (args_info.rcut_given) {
      analyzer = std::make_unique<GCNSeq>(info, dumpFileName, sele1, sele2,
					  args_info.rcut_arg,
					  args_info.nbins_arg);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "A cutoff radius (rcut) must be specified when calculating\n"
               "\tGeneralized Coordinate Number");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.ca1_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType dropletR(0.0);
    if (args_info.dropletR_given)
      dropletR = args_info.dropletR_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--dropletR must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer =
      std::make_unique<ContactAngle1>(info, dumpFileName, sele1, sele2,
				      solidZ, dropletR);
  } else if (args_info.ca2_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidX(0.0);
    if (args_info.centroidX_given)
      centroidX = args_info.centroidX_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidX must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidY(0.0);
    if (args_info.centroidY_given)
      centroidY = args_info.centroidY_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidY must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType threshDens(0.0);
    if (args_info.threshDens_given)
      threshDens = args_info.threshDens_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--threshDens must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType bufferLength(0.0);
    if (args_info.bufferLength_given)
      bufferLength = args_info.bufferLength_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--bufferLength must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer = std::make_unique<ContactAngle2>(info, dumpFileName, sele1,
					       sele2, solidZ, centroidX,
					       centroidY, threshDens,
					       bufferLength,
					       args_info.nbins_arg,
					       args_info.nbins_z_arg);
  }

  if (analyzer != NULL) {
    
    if (args_info.output_given) {
      analyzer->setOutputName(args_info.output_arg);
    }

    analyzer->doSequence();
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "SequentialProps: No Analyzer was created, nothing to do!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  delete info;

  return 0;
}